

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

int mp_check_ext_data_test(int8_t type,char *data,uint32_t len)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 1;
  if (type == 'B') {
    if (len == 0) {
      return 0;
    }
    if ((byte)*data == len) {
      uVar4 = (ulong)len;
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (uVar4 == uVar3) break;
        len = len - 1;
        uVar1 = uVar3 + 1;
      } while (len == (byte)data[uVar3]);
      uVar2 = (uint)(uVar3 < uVar4);
    }
  }
  return uVar2;
}

Assistant:

int
mp_check_ext_data_test(int8_t type, const char *data, uint32_t len)
{
	if (type != 0x42)
		return 1;
	for (uint32_t i = 0; i < len; i++) {
		if ((unsigned char)data[i] != len - i)
			return 1;
	}
	return 0;
}